

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void InterpolateRow_16_C(uint16_t *dst_ptr,uint16_t *src_ptr,ptrdiff_t src_stride,int width,
                        int source_y_fraction)

{
  int iVar1;
  uint in_ECX;
  ptrdiff_t in_RDX;
  uint16_t *in_RSI;
  uint16_t *in_RDI;
  int in_R8D;
  int x;
  uint16_t *src_ptr1;
  int y0_fraction;
  int y1_fraction;
  int local_34;
  ushort *local_30;
  ushort *local_10;
  uint16_t *local_8;
  
  iVar1 = 0x100 - in_R8D;
  local_30 = in_RSI + in_RDX;
  if (in_R8D == 0) {
    memcpy(in_RDI,in_RSI,(long)(int)(in_ECX << 1));
  }
  else if (in_R8D == 0x80) {
    libyuv::HalfRow_16_C(in_RSI,in_RDX,in_RDI,in_ECX);
  }
  else {
    local_10 = in_RSI;
    local_8 = in_RDI;
    for (local_34 = 0; local_34 < (int)(in_ECX - 1); local_34 = local_34 + 2) {
      *local_8 = (uint16_t)((uint)*local_10 * iVar1 + (uint)*local_30 * in_R8D >> 8);
      local_8[1] = (uint16_t)((uint)local_10[1] * iVar1 + (uint)local_30[1] * in_R8D >> 8);
      local_10 = local_10 + 2;
      local_30 = local_30 + 2;
      local_8 = local_8 + 2;
    }
    if ((in_ECX & 1) != 0) {
      *local_8 = (uint16_t)((uint)*local_10 * iVar1 + (uint)*local_30 * in_R8D >> 8);
    }
  }
  return;
}

Assistant:

void InterpolateRow_16_C(uint16_t* dst_ptr,
                         const uint16_t* src_ptr,
                         ptrdiff_t src_stride,
                         int width,
                         int source_y_fraction) {
  int y1_fraction = source_y_fraction;
  int y0_fraction = 256 - y1_fraction;
  const uint16_t* src_ptr1 = src_ptr + src_stride;
  int x;
  if (source_y_fraction == 0) {
    memcpy(dst_ptr, src_ptr, width * 2);
    return;
  }
  if (source_y_fraction == 128) {
    HalfRow_16_C(src_ptr, src_stride, dst_ptr, width);
    return;
  }
  for (x = 0; x < width - 1; x += 2) {
    dst_ptr[0] = (src_ptr[0] * y0_fraction + src_ptr1[0] * y1_fraction) >> 8;
    dst_ptr[1] = (src_ptr[1] * y0_fraction + src_ptr1[1] * y1_fraction) >> 8;
    src_ptr += 2;
    src_ptr1 += 2;
    dst_ptr += 2;
  }
  if (width & 1) {
    dst_ptr[0] = (src_ptr[0] * y0_fraction + src_ptr1[0] * y1_fraction) >> 8;
  }
}